

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.cpp
# Opt level: O0

ostream * setup::operator<<(ostream *os,data *version)

{
  ostream *poVar1;
  uint *in_RSI;
  ostream *in_RDI;
  
  poVar1 = (ostream *)std::ostream::operator<<(in_RDI,*in_RSI);
  poVar1 = std::operator<<(poVar1,'.');
  std::ostream::operator<<(poVar1,in_RSI[1]);
  if (in_RSI[2] != 0) {
    std::ostream::operator<<(in_RDI,in_RSI[2]);
  }
  return in_RDI;
}

Assistant:

std::ostream & operator<<(std::ostream & os, const windows_version::data & version) {
	os << version.major << '.' << version.minor;
	if(version.build) {
		os << version.build;
	}
	return os;
}